

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaForce.c
# Opt level: O2

void Frc_ManCrossCutTest(Frc_Man_t *p,Vec_Int_t *vOrderInit)

{
  uint uVar1;
  Vec_Int_t *vOrder;
  
  vOrder = vOrderInit;
  if (vOrderInit == (Vec_Int_t *)0x0) {
    vOrder = Frc_ManCollectCos(p);
  }
  uVar1 = Frc_ManCrossCut(p,vOrder,0);
  printf("CrossCut = %6d\n",(ulong)uVar1);
  uVar1 = Frc_ManCrossCut(p,vOrder,1);
  printf("CrossCut = %6d\n",(ulong)uVar1);
  Vec_IntReverseOrder(vOrder);
  uVar1 = Frc_ManCrossCut(p,vOrder,0);
  printf("CrossCut = %6d\n",(ulong)uVar1);
  uVar1 = Frc_ManCrossCut(p,vOrder,1);
  printf("CrossCut = %6d\n",(ulong)uVar1);
  Vec_IntReverseOrder(vOrder);
  if (vOrder != vOrderInit) {
    Vec_IntFree(vOrder);
    return;
  }
  return;
}

Assistant:

void Frc_ManCrossCutTest( Frc_Man_t * p, Vec_Int_t * vOrderInit )
{
    Vec_Int_t * vOrder;
//    abctime clk = Abc_Clock();
    vOrder = vOrderInit? vOrderInit : Frc_ManCollectCos( p );
    printf( "CrossCut = %6d\n", Frc_ManCrossCut( p, vOrder, 0 ) );
    printf( "CrossCut = %6d\n", Frc_ManCrossCut( p, vOrder, 1 ) );
    Vec_IntReverseOrder( vOrder );
    printf( "CrossCut = %6d\n", Frc_ManCrossCut( p, vOrder, 0 ) );
    printf( "CrossCut = %6d\n", Frc_ManCrossCut( p, vOrder, 1 ) );
    Vec_IntReverseOrder( vOrder );
    if ( vOrder != vOrderInit )
        Vec_IntFree( vOrder );
//    ABC_PRT( "Time", Abc_Clock() - clk );
}